

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void av1_dec_row_mt_dealloc(AV1DecRowMTSync *dec_row_mt_sync)

{
  long lVar1;
  long lVar2;
  
  if (dec_row_mt_sync != (AV1DecRowMTSync *)0x0) {
    if (dec_row_mt_sync->mutex_ != (pthread_mutex_t *)0x0) {
      if (0 < dec_row_mt_sync->allocated_sb_rows) {
        lVar1 = 0;
        lVar2 = 0;
        do {
          pthread_mutex_destroy((pthread_mutex_t *)((long)dec_row_mt_sync->mutex_ + lVar1));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0x28;
        } while (lVar2 < dec_row_mt_sync->allocated_sb_rows);
      }
      aom_free(dec_row_mt_sync->mutex_);
    }
    if (dec_row_mt_sync->cond_ != (pthread_cond_t *)0x0) {
      if (0 < dec_row_mt_sync->allocated_sb_rows) {
        lVar1 = 0;
        lVar2 = 0;
        do {
          pthread_cond_destroy((pthread_cond_t *)((long)dec_row_mt_sync->cond_ + lVar1));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0x30;
        } while (lVar2 < dec_row_mt_sync->allocated_sb_rows);
      }
      aom_free(dec_row_mt_sync->cond_);
    }
    aom_free(dec_row_mt_sync->cur_sb_col);
    dec_row_mt_sync->mi_rows_parse_done = 0;
    dec_row_mt_sync->mi_rows_decode_started = 0;
    *(undefined8 *)&dec_row_mt_sync->num_threads_working = 0;
    dec_row_mt_sync->sync_range = 0;
    dec_row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
    dec_row_mt_sync->mi_rows = 0;
    dec_row_mt_sync->mi_cols = 0;
    *(undefined8 *)&dec_row_mt_sync->allocated_sb_rows = 0;
    dec_row_mt_sync->cur_sb_col = (int *)0x0;
    dec_row_mt_sync->mutex_ = (pthread_mutex_t *)0x0;
    dec_row_mt_sync->cond_ = (pthread_cond_t *)0x0;
  }
  return;
}

Assistant:

void av1_dec_row_mt_dealloc(AV1DecRowMTSync *dec_row_mt_sync) {
  if (dec_row_mt_sync != NULL) {
#if CONFIG_MULTITHREAD
    int i;
    if (dec_row_mt_sync->mutex_ != NULL) {
      for (i = 0; i < dec_row_mt_sync->allocated_sb_rows; ++i) {
        pthread_mutex_destroy(&dec_row_mt_sync->mutex_[i]);
      }
      aom_free(dec_row_mt_sync->mutex_);
    }
    if (dec_row_mt_sync->cond_ != NULL) {
      for (i = 0; i < dec_row_mt_sync->allocated_sb_rows; ++i) {
        pthread_cond_destroy(&dec_row_mt_sync->cond_[i]);
      }
      aom_free(dec_row_mt_sync->cond_);
    }
#endif  // CONFIG_MULTITHREAD
    aom_free(dec_row_mt_sync->cur_sb_col);

    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*dec_row_mt_sync);
  }
}